

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadExtend<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,wabt::interp::Simd<unsigned_int,(unsigned_char)2>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult RVar2;
  Simd<unsigned_long,_(unsigned_char)__x02_> value;
  Simd<unsigned_int,_(unsigned_char)__x02_> local_10;
  
  RVar1 = Load<wabt::interp::Simd<unsigned_int,(unsigned_char)2>>(this,instr,&local_10,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    value.v[0] = (ulong)local_10.v[0];
    value.v[1]._0_4_ = local_10.v[1];
    value.v[1]._4_4_ = 0;
    Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,value);
    RVar2 = Ok;
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadExtend(Instr instr, Trap::Ptr* out_trap) {
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[i];
  }
  Push(result);
  return RunResult::Ok;
}